

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsComponentAddRelation(FmsComponent comp,FmsInt other_comp_id)

{
  ulong uVar1;
  ulong uVar2;
  FmsInt *__ptr;
  ulong uVar3;
  
  if (comp == (FmsComponent)0x0) {
    return 1;
  }
  uVar1 = comp->num_relations;
  __ptr = comp->relations;
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar3 < uVar1 + 1);
  if (uVar1 <= uVar3 >> 1) {
    __ptr = (FmsInt *)realloc(__ptr,uVar3 << 3);
    if (__ptr == (FmsInt *)0x0) {
      return 2;
    }
    comp->relations = __ptr;
  }
  __ptr[uVar1] = other_comp_id;
  comp->num_relations = uVar1 + 1;
  return 0;
}

Assistant:

int FmsComponentAddRelation(FmsComponent comp, FmsInt other_comp_id) {
  if (!comp) { E_RETURN(1); }
  FmsInt num_relations = comp->num_relations;
  FmsInt *relations = comp->relations;
  FmsInt nc = NextPow2(num_relations + 1);
  if (num_relations <= nc/2) {
    relations = realloc(relations, nc*sizeof(FmsInt));
    if (relations == NULL) { E_RETURN(2); }
    comp->relations = relations;
  }
  relations[num_relations] = other_comp_id;
  comp->num_relations = num_relations + 1;
  return 0;
}